

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  seqStore_t *psVar5;
  U32 lowestValid;
  ulong uVar6;
  seqDef *psVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong *puVar17;
  ulong *puVar18;
  BYTE *pBVar19;
  uint uVar20;
  BYTE *litEnd;
  uint uVar21;
  ulong uVar22;
  ulong *puVar23;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  uint local_c0;
  uint local_bc;
  size_t local_b8;
  ZSTD_matchState_t *local_b0;
  ulong *local_a8;
  ulong *local_a0;
  uint local_94;
  ulong *local_90;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  uint local_6c;
  uint local_68;
  uint local_64;
  seqStore_t *local_60;
  ulong *local_58;
  long local_50;
  ulong *local_48;
  uint *local_40;
  BYTE *local_38;
  
  puVar17 = (ulong *)((long)src + srcSize);
  pBVar19 = (ms->window).base;
  uVar21 = (ms->window).dictLimit;
  local_38 = pBVar19 + uVar21;
  uVar16 = (ms->cParams).minMatch;
  uVar20 = 6;
  if (uVar16 < 6) {
    uVar20 = uVar16;
  }
  local_94 = 4;
  if (4 < uVar20) {
    local_94 = uVar20;
  }
  local_64 = *rep;
  puVar18 = (ulong *)((ulong)((int)src == (int)local_38) + (long)src);
  iVar12 = (int)puVar18 - (int)pBVar19;
  uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_68 = iVar12 - uVar16;
  if (iVar12 - uVar21 <= uVar16) {
    local_68 = uVar21;
  }
  if (ms->loadedDictEnd != 0) {
    local_68 = uVar21;
  }
  local_6c = rep[1];
  local_68 = iVar12 - local_68;
  local_bc = local_6c;
  if (local_68 < local_6c) {
    local_bc = 0;
  }
  uVar21 = local_64;
  if (local_68 < local_64) {
    uVar21 = 0;
  }
  uVar22 = (ulong)uVar21;
  local_a0 = (ulong *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  if (puVar18 < local_a0) {
    puVar9 = (ulong *)((long)puVar17 + -7);
    local_78 = (ulong *)((long)puVar17 + -3);
    local_80 = (ulong *)((long)puVar17 + -1);
    local_48 = puVar17 + -4;
    local_b0 = ms;
    local_a8 = puVar9;
    local_90 = puVar17;
    local_60 = seqStore;
    local_40 = rep;
    do {
      uVar21 = (uint)uVar22;
      local_50 = -uVar22;
      if (uVar21 == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        if (*(int *)(((long)puVar18 + 1) - uVar22) == *(int *)((long)puVar18 + 1)) {
          puVar2 = (ulong *)((long)puVar18 + 5);
          puVar8 = (ulong *)((long)puVar18 + local_50 + 5);
          puVar23 = puVar2;
          if (puVar2 < puVar9) {
            if (*puVar8 == *puVar2) {
              lVar11 = 0;
              do {
                puVar23 = (ulong *)((long)puVar18 + lVar11 + 0xd);
                if (puVar9 <= puVar23) {
                  puVar8 = (ulong *)((long)puVar18 + local_50 + lVar11 + 0xd);
                  puVar23 = (ulong *)((long)puVar18 + lVar11 + 0xd);
                  goto LAB_0077ce03;
                }
                uVar13 = *(ulong *)((long)puVar18 + lVar11 + local_50 + 0xd);
                uVar15 = *puVar23;
                lVar11 = lVar11 + 8;
              } while (uVar13 == uVar15);
              uVar15 = uVar15 ^ uVar13;
              uVar13 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = (uVar13 >> 3 & 0x1fffffff) + lVar11;
            }
            else {
              uVar15 = *puVar2 ^ *puVar8;
              uVar13 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = uVar13 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0077ce03:
            if ((puVar23 < local_78) && ((int)*puVar8 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar8 = (ulong *)((long)puVar8 + 4);
            }
            if ((puVar23 < local_80) && ((short)*puVar8 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar8 = (ulong *)((long)puVar8 + 2);
            }
            if (puVar23 < puVar17) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar8 == (BYTE)*puVar23));
            }
            uVar13 = (long)puVar23 - (long)puVar2;
          }
          uVar13 = uVar13 + 4;
        }
      }
      local_b8 = 999999999;
      if (local_94 == 6) {
        uVar15 = ZSTD_HcFindBestMatch_noDict_6(local_b0,(BYTE *)puVar18,(BYTE *)puVar17,&local_b8);
      }
      else if (local_94 == 5) {
        uVar15 = ZSTD_HcFindBestMatch_noDict_5(local_b0,(BYTE *)puVar18,(BYTE *)puVar17,&local_b8);
      }
      else {
        uVar15 = ZSTD_HcFindBestMatch_noDict_4(local_b0,(BYTE *)puVar18,(BYTE *)puVar17,&local_b8);
      }
      uVar6 = uVar13;
      if (uVar13 < uVar15) {
        uVar6 = uVar15;
      }
      if (uVar6 < 4) {
        uVar13 = (long)puVar18 - (long)src;
        puVar18 = (ulong *)((long)puVar18 + (uVar13 >> 8) + 1);
        local_b0->lazySkipping = (uint)(0x7ff < uVar13);
        puVar9 = local_a8;
      }
      else {
        puVar9 = puVar18;
        uVar22 = local_b8;
        if (uVar15 <= uVar13) {
          puVar9 = (ulong *)((long)puVar18 + 1);
          uVar22 = 1;
        }
        uVar13 = uVar6;
        if (puVar18 < local_a0) {
          puVar17 = (ulong *)((long)puVar18 + 0xd);
          local_88 = puVar9;
          local_58 = (ulong *)src;
          do {
            puVar2 = (ulong *)((long)puVar18 + 1);
            uVar13 = uVar6;
            if (uVar22 == 0) {
              uVar22 = 0;
            }
            else if ((uVar21 != 0) && (*(int *)puVar2 == *(int *)((long)puVar2 + local_50))) {
              puVar9 = (ulong *)((long)puVar18 + local_50 + 5);
              puVar18 = (ulong *)((long)puVar18 + 5);
              puVar23 = puVar18;
              if (puVar18 < local_a8) {
                if (*puVar9 == *puVar18) {
                  lVar11 = 0;
                  puVar23 = puVar17;
                  do {
                    if (local_a8 <= puVar23) {
                      puVar9 = (ulong *)((long)puVar23 + local_50);
                      goto LAB_0077cfbb;
                    }
                    puVar9 = (ulong *)((long)puVar23 + local_50);
                    uVar15 = *puVar23;
                    puVar23 = puVar23 + 1;
                    lVar11 = lVar11 + 8;
                  } while (*puVar9 == uVar15);
                  uVar15 = uVar15 ^ *puVar9;
                  uVar10 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                    }
                  }
                  uVar15 = (uVar10 >> 3 & 0x1fffffff) + lVar11;
                }
                else {
                  uVar10 = *puVar18 ^ *puVar9;
                  uVar15 = 0;
                  if (uVar10 != 0) {
                    for (; (uVar10 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  uVar15 = uVar15 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0077cfbb:
                if ((puVar23 < local_78) && ((int)*puVar9 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar9 = (ulong *)((long)puVar9 + 4);
                }
                if ((puVar23 < local_80) && ((short)*puVar9 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar9 = (ulong *)((long)puVar9 + 2);
                }
                if (puVar23 < local_90) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar23));
                }
                uVar15 = (long)puVar23 - (long)puVar18;
              }
              uVar16 = (uint)uVar22;
              if (uVar16 == 0) goto LAB_0077d583;
              if (uVar15 < 0xfffffffffffffffc) {
                uVar20 = 0x1f;
                if (uVar16 != 0) {
                  for (; uVar16 >> uVar20 == 0; uVar20 = uVar20 - 1) {
                  }
                }
                if ((int)((uVar20 ^ 0x1f) + (int)uVar6 * 3 + -0x1e) < (int)(uVar15 + 4) * 3) {
                  uVar22 = 1;
                  uVar13 = uVar15 + 4;
                  local_88 = puVar2;
                }
              }
            }
            local_b8 = 999999999;
            if (local_94 == 6) {
              uVar6 = ZSTD_HcFindBestMatch_noDict_6
                                (local_b0,(BYTE *)puVar2,(BYTE *)local_90,&local_b8);
            }
            else if (local_94 == 5) {
              uVar6 = ZSTD_HcFindBestMatch_noDict_5
                                (local_b0,(BYTE *)puVar2,(BYTE *)local_90,&local_b8);
            }
            else {
              uVar6 = ZSTD_HcFindBestMatch_noDict_4
                                (local_b0,(BYTE *)puVar2,(BYTE *)local_90,&local_b8);
            }
            uVar16 = (uint)local_b8;
            if ((uVar16 == 0) || (uVar20 = (uint)uVar22, uVar20 == 0)) {
LAB_0077d583:
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                            ,0xab,"unsigned int ZSTD_highbit32(U32)");
            }
            puVar9 = local_88;
            src = local_58;
            if (uVar6 < 4) break;
            iVar12 = 0x1f;
            if (uVar16 != 0) {
              for (; uVar16 >> iVar12 == 0; iVar12 = iVar12 + -1) {
              }
            }
            uVar16 = 0x1f;
            if (uVar20 != 0) {
              for (; uVar20 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            if (((int)uVar6 * 4 - iVar12 <= (int)((uVar16 ^ 0x1f) + (int)uVar13 * 4 + -0x1b)) ||
               (puVar17 = (ulong *)((long)puVar17 + 1), uVar22 = local_b8, uVar13 = uVar6,
               puVar18 = puVar2, puVar9 = puVar2, local_88 = puVar2, local_a0 <= puVar2)) break;
          } while( true );
        }
        psVar5 = local_60;
        local_c0 = uVar21;
        if (3 < uVar22) {
          if ((src < puVar9) && (local_38 < (BYTE *)((long)puVar9 + (3 - uVar22)))) {
            puVar17 = puVar9;
            while (puVar9 = puVar17,
                  *(BYTE *)((long)puVar17 - 1) == *(BYTE *)((long)puVar17 + (2 - uVar22))) {
              puVar9 = (ulong *)((long)puVar17 - 1);
              uVar13 = uVar13 + 1;
              if ((puVar9 <= src) ||
                 (pBVar19 = (BYTE *)((long)puVar17 + (2 - uVar22)), puVar17 = puVar9,
                 pBVar19 <= local_38)) break;
            }
          }
          local_c0 = (U32)uVar22 - 3;
          local_bc = uVar21;
        }
        if (local_60->maxNbSeq <=
            (ulong)((long)local_60->sequences - (long)local_60->sequencesStart >> 3)) {
LAB_0077d5ff:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_60->maxNbLit) {
LAB_0077d61e:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar15 = (long)puVar9 - (long)src;
        puVar17 = (ulong *)local_60->lit;
        if (local_60->litStart + local_60->maxNbLit < (BYTE *)((long)puVar17 + uVar15)) {
LAB_0077d5a2:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_90 < puVar9) {
LAB_0077d5c1:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_48 < puVar9) {
          ZSTD_safecopyLiterals((BYTE *)puVar17,(BYTE *)src,(BYTE *)puVar9,(BYTE *)local_48);
LAB_0077d1f0:
          psVar5->lit = psVar5->lit + uVar15;
          if (0xffff < uVar15) {
            if (psVar5->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            psVar5->longLengthType = ZSTD_llt_literalLength;
            psVar5->longLengthPos =
                 (U32)((ulong)((long)psVar5->sequences - (long)psVar5->sequencesStart) >> 3);
          }
        }
        else {
          uVar6 = *(ulong *)((long)src + 8);
          *puVar17 = *src;
          puVar17[1] = uVar6;
          pBVar19 = local_60->lit;
          if (0x10 < uVar15) {
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar6 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar19 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar19 + 0x18) = uVar6;
            if (0x20 < (long)uVar15) {
              lVar11 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar11 + 0x20);
                uVar4 = puVar3[1];
                pBVar1 = pBVar19 + lVar11 + 0x20;
                *(undefined8 *)pBVar1 = *puVar3;
                *(undefined8 *)(pBVar1 + 8) = uVar4;
                puVar3 = (undefined8 *)((long)src + lVar11 + 0x30);
                uVar4 = puVar3[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar1 + 0x18) = uVar4;
                lVar11 = lVar11 + 0x20;
              } while (pBVar1 + 0x20 < pBVar19 + uVar15);
            }
            goto LAB_0077d1f0;
          }
          local_60->lit = pBVar19 + uVar15;
        }
        puVar17 = local_90;
        psVar7 = psVar5->sequences;
        psVar7->litLength = (U16)uVar15;
        psVar7->offBase = (U32)uVar22;
        if (uVar13 < 3) {
LAB_0077d5e0:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar13 - 3) {
          if (psVar5->longLengthType != ZSTD_llt_none) {
LAB_0077d63d:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          psVar5->longLengthType = ZSTD_llt_matchLength;
          psVar5->longLengthPos = (U32)((ulong)((long)psVar7 - (long)psVar5->sequencesStart) >> 3);
        }
        psVar7->mlBase = (U16)(uVar13 - 3);
        psVar7 = psVar7 + 1;
        psVar5->sequences = psVar7;
        if (local_b0->lazySkipping != 0) {
          local_b0->lazySkipping = 0;
        }
        puVar18 = (ulong *)((long)puVar9 + uVar13);
        puVar9 = local_a8;
        if ((local_bc == 0) || (local_a0 < puVar18)) {
          src = puVar18;
          uVar22 = (ulong)local_c0;
        }
        else {
          uVar22 = (ulong)local_c0;
          uVar13 = (ulong)local_bc;
          while( true ) {
            uVar15 = uVar13;
            uVar13 = uVar22;
            uVar21 = (uint)uVar13;
            src = puVar18;
            uVar22 = uVar13;
            local_bc = (uint)uVar15;
            if ((int)*puVar18 != *(int *)((long)puVar18 - uVar15)) break;
            lVar11 = -uVar15;
            puVar2 = (ulong *)((long)puVar18 + 4);
            puVar8 = (ulong *)((long)puVar18 + lVar11 + 4);
            puVar23 = puVar2;
            if (puVar2 < puVar9) {
              if (*puVar8 == *puVar2) {
                lVar14 = 0;
                do {
                  puVar23 = (ulong *)((long)puVar18 + lVar14 + 0xc);
                  if (puVar9 <= puVar23) {
                    puVar8 = (ulong *)((long)puVar18 + lVar11 + lVar14 + 0xc);
                    puVar23 = (ulong *)((long)puVar18 + lVar14 + 0xc);
                    goto LAB_0077d3c8;
                  }
                  uVar22 = *(ulong *)((long)puVar18 + lVar14 + lVar11 + 0xc);
                  uVar6 = *puVar23;
                  lVar14 = lVar14 + 8;
                } while (uVar22 == uVar6);
                uVar6 = uVar6 ^ uVar22;
                uVar22 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = (uVar22 >> 3 & 0x1fffffff) + lVar14;
              }
              else {
                uVar6 = *puVar2 ^ *puVar8;
                uVar22 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0077d3c8:
              if ((puVar23 < local_78) && ((int)*puVar8 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar8 = (ulong *)((long)puVar8 + 4);
              }
              if ((puVar23 < local_80) && ((short)*puVar8 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar8 = (ulong *)((long)puVar8 + 2);
              }
              if (puVar23 < puVar17) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar8 == (BYTE)*puVar23));
              }
              uVar22 = (long)puVar23 - (long)puVar2;
            }
            if (psVar5->maxNbSeq <= (ulong)((long)psVar7 - (long)psVar5->sequencesStart >> 3))
            goto LAB_0077d5ff;
            if (0x20000 < psVar5->maxNbLit) goto LAB_0077d61e;
            puVar2 = (ulong *)psVar5->lit;
            if (psVar5->litStart + psVar5->maxNbLit < puVar2) goto LAB_0077d5a2;
            if (puVar17 < puVar18) goto LAB_0077d5c1;
            if (local_48 < puVar18) {
              ZSTD_safecopyLiterals((BYTE *)puVar2,(BYTE *)puVar18,(BYTE *)puVar18,(BYTE *)local_48)
              ;
              puVar9 = local_a8;
            }
            else {
              uVar6 = puVar18[1];
              *puVar2 = *puVar18;
              puVar2[1] = uVar6;
            }
            psVar7 = psVar5->sequences;
            psVar7->litLength = 0;
            psVar7->offBase = 1;
            if (uVar22 + 4 < 3) goto LAB_0077d5e0;
            if (0xffff < uVar22 + 1) {
              if (psVar5->longLengthType != ZSTD_llt_none) goto LAB_0077d63d;
              psVar5->longLengthType = ZSTD_llt_matchLength;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar7 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar7->mlBase = (U16)(uVar22 + 1);
            psVar7 = psVar7 + 1;
            psVar5->sequences = psVar7;
            puVar18 = (ulong *)((long)puVar18 + uVar22 + 4);
            src = puVar18;
            uVar22 = uVar15;
            local_bc = uVar21;
            if ((uVar21 == 0) || (local_a0 < puVar18)) break;
          }
        }
      }
      uVar21 = (uint)uVar22;
      rep = local_40;
    } while (puVar18 < local_a0);
  }
  if (local_6c <= local_68) {
    local_6c = 0;
  }
  uVar16 = local_6c;
  if (uVar21 != 0) {
    uVar16 = local_64;
  }
  if (local_64 <= local_68) {
    uVar16 = local_6c;
    local_64 = 0;
  }
  if (uVar21 != 0) {
    local_64 = uVar21;
  }
  if (local_bc != 0) {
    uVar16 = local_bc;
  }
  *rep = local_64;
  rep[1] = uVar16;
  return (long)puVar17 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_noDict);
}